

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

ValueType ToWabtValueType(wasm_valkind_t kind)

{
  Type local_c;
  wasm_valkind_t kind_local;
  
  if (kind == '\0') {
    wabt::Type::Type(&local_c,I32);
  }
  else if (kind == '\x01') {
    wabt::Type::Type(&local_c,I64);
  }
  else if (kind == '\x02') {
    wabt::Type::Type(&local_c,F32);
  }
  else if (kind == '\x03') {
    wabt::Type::Type(&local_c,F64);
  }
  else if (kind == 0x80) {
    wabt::Type::Type(&local_c,Anyref);
  }
  else {
    if (kind != 0x81) {
      fprintf(_stderr,"CAPI: [%s] unexpected wasm_valkind_t: %d\n","ToWabtValueType",(ulong)kind);
      abort();
    }
    wabt::Type::Type(&local_c,Funcref);
  }
  return (ValueType)local_c.enum_;
}

Assistant:

static ValueType ToWabtValueType(wasm_valkind_t kind) {
  switch (kind) {
    case WASM_I32:
      return ValueType::I32;
    case WASM_I64:
      return ValueType::I64;
    case WASM_F32:
      return ValueType::F32;
    case WASM_F64:
      return ValueType::F64;
    case WASM_ANYREF:
      return ValueType::Anyref;
    case WASM_FUNCREF:
      return ValueType::Funcref;
    default:
      TRACE("unexpected wasm_valkind_t: %d", kind);
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}